

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bnll_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::BNLL_x86_fma::forward_inplace(BNLL_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  undefined1 auVar4 [32];
  long lVar5;
  undefined1 (*pauVar6) [32];
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar35 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  
  iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar11 = 0;
  uVar10 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar10 = uVar11;
  }
  auVar83 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
  for (; uVar11 != uVar10; uVar11 = uVar11 + 1) {
    pvVar1 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    pauVar6 = (undefined1 (*) [32])(sVar3 * uVar11 * sVar2 + (long)pvVar1);
    lVar9 = 0;
    for (iVar8 = 0; auVar35 = auVar83._0_16_, iVar8 + 7 < iVar7; iVar8 = iVar8 + 8) {
      auVar16._8_4_ = 0x80000000;
      auVar16._0_8_ = 0x8000000080000000;
      auVar16._12_4_ = 0x80000000;
      auVar16._16_4_ = 0x80000000;
      auVar16._20_4_ = 0x80000000;
      auVar16._24_4_ = 0x80000000;
      auVar16._28_4_ = 0x80000000;
      auVar16 = vorps_avx(*pauVar6,auVar16);
      auVar25._8_4_ = 0x42b0c0a5;
      auVar25._0_8_ = 0x42b0c0a542b0c0a5;
      auVar25._12_4_ = 0x42b0c0a5;
      auVar25._16_4_ = 0x42b0c0a5;
      auVar25._20_4_ = 0x42b0c0a5;
      auVar25._24_4_ = 0x42b0c0a5;
      auVar25._28_4_ = 0x42b0c0a5;
      auVar16 = vminps_avx(auVar16,auVar25);
      auVar26._8_4_ = 0xc2b0c0a5;
      auVar26._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar26._12_4_ = 0xc2b0c0a5;
      auVar26._16_4_ = 0xc2b0c0a5;
      auVar26._20_4_ = 0xc2b0c0a5;
      auVar26._24_4_ = 0xc2b0c0a5;
      auVar26._28_4_ = 0xc2b0c0a5;
      auVar4 = vmaxps_avx(auVar16,auVar26);
      auVar27._8_4_ = 0x3fb8aa3b;
      auVar27._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar27._12_4_ = 0x3fb8aa3b;
      auVar27._16_4_ = 0x3fb8aa3b;
      auVar27._20_4_ = 0x3fb8aa3b;
      auVar27._24_4_ = 0x3fb8aa3b;
      auVar27._28_4_ = 0x3fb8aa3b;
      auVar78._8_4_ = 0x3f000000;
      auVar78._0_8_ = 0x3f0000003f000000;
      auVar78._12_4_ = 0x3f000000;
      auVar78._16_4_ = 0x3f000000;
      auVar78._20_4_ = 0x3f000000;
      auVar78._24_4_ = 0x3f000000;
      auVar78._28_4_ = 0x3f000000;
      auVar14 = vfmadd213ps_fma(auVar27,auVar4,auVar78);
      auVar18 = vroundps_avx(ZEXT1632(auVar14),1);
      auVar16 = vcmpps_avx(ZEXT1632(auVar14),auVar18,1);
      auVar51._8_4_ = 0x3f800000;
      auVar51._0_8_ = 0x3f8000003f800000;
      auVar51._12_4_ = 0x3f800000;
      auVar51._16_4_ = 0x3f800000;
      auVar51._20_4_ = 0x3f800000;
      auVar51._24_4_ = 0x3f800000;
      auVar51._28_4_ = 0x3f800000;
      auVar16 = vandps_avx(auVar16,auVar51);
      auVar16 = vsubps_avx(auVar18,auVar16);
      auVar80._8_4_ = 0x3f318000;
      auVar80._0_8_ = 0x3f3180003f318000;
      auVar80._12_4_ = 0x3f318000;
      auVar80._16_4_ = 0x3f318000;
      auVar80._20_4_ = 0x3f318000;
      auVar80._24_4_ = 0x3f318000;
      auVar80._28_4_ = 0x3f318000;
      auVar14 = vfmsub231ps_fma(auVar4,auVar16,auVar80);
      auVar82._8_4_ = 0xb95e8083;
      auVar82._0_8_ = 0xb95e8083b95e8083;
      auVar82._12_4_ = 0xb95e8083;
      auVar82._16_4_ = 0xb95e8083;
      auVar82._20_4_ = 0xb95e8083;
      auVar82._24_4_ = 0xb95e8083;
      auVar82._28_4_ = 0xb95e8083;
      auVar19 = vfnmsub231ps_fma(ZEXT1632(auVar14),auVar16,auVar82);
      auVar17 = ZEXT1632(auVar19);
      auVar4._28_4_ = auVar18._28_4_;
      auVar4._0_28_ =
           ZEXT1628(CONCAT412(auVar19._12_4_ * auVar19._12_4_,
                              CONCAT48(auVar19._8_4_ * auVar19._8_4_,
                                       CONCAT44(auVar19._4_4_ * auVar19._4_4_,
                                                auVar19._0_4_ * auVar19._0_4_))));
      auVar42._8_4_ = 0x39506967;
      auVar42._0_8_ = 0x3950696739506967;
      auVar42._12_4_ = 0x39506967;
      auVar42._16_4_ = 0x39506967;
      auVar42._20_4_ = 0x39506967;
      auVar42._24_4_ = 0x39506967;
      auVar42._28_4_ = 0x39506967;
      auVar65._8_4_ = 0x3ab743ce;
      auVar65._0_8_ = 0x3ab743ce3ab743ce;
      auVar65._12_4_ = 0x3ab743ce;
      auVar65._16_4_ = 0x3ab743ce;
      auVar65._20_4_ = 0x3ab743ce;
      auVar65._24_4_ = 0x3ab743ce;
      auVar65._28_4_ = 0x3ab743ce;
      auVar14 = vfmadd213ps_fma(auVar42,auVar17,auVar65);
      auVar66._8_4_ = 0x3c088908;
      auVar66._0_8_ = 0x3c0889083c088908;
      auVar66._12_4_ = 0x3c088908;
      auVar66._16_4_ = 0x3c088908;
      auVar66._20_4_ = 0x3c088908;
      auVar66._24_4_ = 0x3c088908;
      auVar66._28_4_ = 0x3c088908;
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar17,auVar66);
      auVar67._8_4_ = 0x3d2aa9c1;
      auVar67._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar67._12_4_ = 0x3d2aa9c1;
      auVar67._16_4_ = 0x3d2aa9c1;
      auVar67._20_4_ = 0x3d2aa9c1;
      auVar67._24_4_ = 0x3d2aa9c1;
      auVar67._28_4_ = 0x3d2aa9c1;
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar17,auVar67);
      auVar68._8_4_ = 0x3e2aaaaa;
      auVar68._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar68._12_4_ = 0x3e2aaaaa;
      auVar68._16_4_ = 0x3e2aaaaa;
      auVar68._20_4_ = 0x3e2aaaaa;
      auVar68._24_4_ = 0x3e2aaaaa;
      auVar68._28_4_ = 0x3e2aaaaa;
      auVar18 = ZEXT1632(auVar19);
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar18,auVar68);
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar18,auVar78);
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar4,auVar18);
      auVar33._0_4_ = auVar14._0_4_ + 1.0;
      auVar33._4_4_ = auVar14._4_4_ + 1.0;
      auVar33._8_4_ = auVar14._8_4_ + 1.0;
      auVar33._12_4_ = auVar14._12_4_ + 1.0;
      auVar33._16_4_ = 0x3f800000;
      auVar33._20_4_ = 0x3f800000;
      auVar33._24_4_ = 0x3f800000;
      auVar33._28_4_ = 0x3f800000;
      auVar14._0_4_ = (int)auVar16._0_4_;
      auVar14._4_4_ = (int)auVar16._4_4_;
      auVar14._8_4_ = (int)auVar16._8_4_;
      auVar14._12_4_ = (int)auVar16._12_4_;
      auVar18._16_4_ = (int)auVar16._16_4_;
      auVar18._0_16_ = auVar14;
      auVar18._20_4_ = (int)auVar16._20_4_;
      auVar18._24_4_ = (int)auVar16._24_4_;
      auVar18._28_4_ = (int)auVar16._28_4_;
      auVar19 = vpslld_avx(auVar14,0x17);
      auVar14 = vpslld_avx(auVar18._16_16_,0x17);
      auVar14 = vpaddd_avx(auVar35,auVar14);
      auVar35 = vpaddd_avx(auVar35,auVar19);
      auVar17._16_16_ = auVar14;
      auVar17._0_16_ = auVar35;
      auVar19 = vfmadd213ps_fma(auVar17,auVar33,auVar51);
      auVar28._8_4_ = 0x800000;
      auVar28._0_8_ = 0x80000000800000;
      auVar28._12_4_ = 0x800000;
      auVar28._16_4_ = 0x800000;
      auVar28._20_4_ = 0x800000;
      auVar28._24_4_ = 0x800000;
      auVar28._28_4_ = 0x800000;
      auVar16 = vmaxps_avx(ZEXT1632(auVar19),auVar28);
      auVar14 = vpsrld_avx(auVar16._0_16_,0x17);
      auVar35 = vpsrld_avx(auVar16._16_16_,0x17);
      auVar52._8_4_ = 0x807fffff;
      auVar52._0_8_ = 0x807fffff807fffff;
      auVar52._12_4_ = 0x807fffff;
      auVar52._16_4_ = 0x807fffff;
      auVar52._20_4_ = 0x807fffff;
      auVar52._24_4_ = 0x807fffff;
      auVar52._28_4_ = 0x807fffff;
      auVar16 = vandps_avx(auVar16,auVar52);
      auVar18 = vorps_avx(auVar16,auVar78);
      auVar53._8_4_ = 0x3f3504f3;
      auVar53._0_8_ = 0x3f3504f33f3504f3;
      auVar53._12_4_ = 0x3f3504f3;
      auVar53._16_4_ = 0x3f3504f3;
      auVar53._20_4_ = 0x3f3504f3;
      auVar53._24_4_ = 0x3f3504f3;
      auVar53._28_4_ = 0x3f3504f3;
      auVar4 = vcmpps_avx(auVar53,auVar18,2);
      auVar16 = vandnps_avx(auVar4,auVar18);
      auVar29._0_4_ = auVar18._0_4_ + -1.0 + auVar16._0_4_;
      auVar29._4_4_ = auVar18._4_4_ + -1.0 + auVar16._4_4_;
      auVar29._8_4_ = auVar18._8_4_ + -1.0 + auVar16._8_4_;
      auVar29._12_4_ = auVar18._12_4_ + -1.0 + auVar16._12_4_;
      auVar29._16_4_ = auVar18._16_4_ + -1.0 + auVar16._16_4_;
      auVar29._20_4_ = auVar18._20_4_ + -1.0 + auVar16._20_4_;
      auVar29._24_4_ = auVar18._24_4_ + -1.0 + auVar16._24_4_;
      auVar29._28_4_ = auVar18._28_4_ + -1.0 + auVar16._28_4_;
      auVar35 = vpsubd_avx(auVar35,auVar4._16_16_);
      auVar56._8_4_ = 0xffffff81;
      auVar56._0_8_ = 0xffffff81ffffff81;
      auVar56._12_4_ = 0xffffff81;
      auVar35 = vpaddd_avx(auVar35,auVar56);
      auVar14 = vpsubd_avx(auVar14,auVar4._0_16_);
      auVar14 = vpaddd_avx(auVar14,auVar56);
      auVar34._16_16_ = auVar35;
      auVar34._0_16_ = auVar14;
      auVar43._0_4_ = auVar29._0_4_ * auVar29._0_4_;
      auVar43._4_4_ = auVar29._4_4_ * auVar29._4_4_;
      auVar43._8_4_ = auVar29._8_4_ * auVar29._8_4_;
      auVar43._12_4_ = auVar29._12_4_ * auVar29._12_4_;
      auVar43._16_4_ = auVar29._16_4_ * auVar29._16_4_;
      auVar43._20_4_ = auVar29._20_4_ * auVar29._20_4_;
      auVar43._24_4_ = auVar29._24_4_ * auVar29._24_4_;
      auVar43._28_4_ = 0;
      auVar54._8_4_ = 0x3d9021bb;
      auVar54._0_8_ = 0x3d9021bb3d9021bb;
      auVar54._12_4_ = 0x3d9021bb;
      auVar54._16_4_ = 0x3d9021bb;
      auVar54._20_4_ = 0x3d9021bb;
      auVar54._24_4_ = 0x3d9021bb;
      auVar54._28_4_ = 0x3d9021bb;
      auVar69._8_4_ = 0xbdebd1b8;
      auVar69._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar69._12_4_ = 0xbdebd1b8;
      auVar69._16_4_ = 0xbdebd1b8;
      auVar69._20_4_ = 0xbdebd1b8;
      auVar69._24_4_ = 0xbdebd1b8;
      auVar69._28_4_ = 0xbdebd1b8;
      auVar35 = vfmadd213ps_fma(auVar54,auVar29,auVar69);
      auVar70._8_4_ = 0x3def251a;
      auVar70._0_8_ = 0x3def251a3def251a;
      auVar70._12_4_ = 0x3def251a;
      auVar70._16_4_ = 0x3def251a;
      auVar70._20_4_ = 0x3def251a;
      auVar70._24_4_ = 0x3def251a;
      auVar70._28_4_ = 0x3def251a;
      auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar29,auVar70);
      auVar71._8_4_ = 0xbdfe5d4f;
      auVar71._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar71._12_4_ = 0xbdfe5d4f;
      auVar71._16_4_ = 0xbdfe5d4f;
      auVar71._20_4_ = 0xbdfe5d4f;
      auVar71._24_4_ = 0xbdfe5d4f;
      auVar71._28_4_ = 0xbdfe5d4f;
      auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar29,auVar71);
      auVar72._8_4_ = 0x3e11e9bf;
      auVar72._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar72._12_4_ = 0x3e11e9bf;
      auVar72._16_4_ = 0x3e11e9bf;
      auVar72._20_4_ = 0x3e11e9bf;
      auVar72._24_4_ = 0x3e11e9bf;
      auVar72._28_4_ = 0x3e11e9bf;
      auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar29,auVar72);
      auVar73._8_4_ = 0xbe2aae50;
      auVar73._0_8_ = 0xbe2aae50be2aae50;
      auVar73._12_4_ = 0xbe2aae50;
      auVar73._16_4_ = 0xbe2aae50;
      auVar73._20_4_ = 0xbe2aae50;
      auVar73._24_4_ = 0xbe2aae50;
      auVar73._28_4_ = 0xbe2aae50;
      auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar29,auVar73);
      auVar74._8_4_ = 0x3e4cceac;
      auVar74._0_8_ = 0x3e4cceac3e4cceac;
      auVar74._12_4_ = 0x3e4cceac;
      auVar74._16_4_ = 0x3e4cceac;
      auVar74._20_4_ = 0x3e4cceac;
      auVar74._24_4_ = 0x3e4cceac;
      auVar74._28_4_ = 0x3e4cceac;
      auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar29,auVar74);
      auVar75._8_4_ = 0xbe7ffffc;
      auVar75._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar75._12_4_ = 0xbe7ffffc;
      auVar75._16_4_ = 0xbe7ffffc;
      auVar75._20_4_ = 0xbe7ffffc;
      auVar75._24_4_ = 0xbe7ffffc;
      auVar75._28_4_ = 0xbe7ffffc;
      auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar29,auVar75);
      auVar76._8_4_ = 0x3eaaaaaa;
      auVar76._0_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar76._12_4_ = 0x3eaaaaaa;
      auVar76._16_4_ = 0x3eaaaaaa;
      auVar76._20_4_ = 0x3eaaaaaa;
      auVar76._24_4_ = 0x3eaaaaaa;
      auVar76._28_4_ = 0x3eaaaaaa;
      auVar35 = vfmadd213ps_fma(ZEXT1632(auVar35),auVar29,auVar76);
      auVar55._0_4_ = auVar43._0_4_ * auVar29._0_4_ * auVar35._0_4_;
      auVar55._4_4_ = auVar43._4_4_ * auVar29._4_4_ * auVar35._4_4_;
      auVar55._8_4_ = auVar43._8_4_ * auVar29._8_4_ * auVar35._8_4_;
      auVar55._12_4_ = auVar43._12_4_ * auVar29._12_4_ * auVar35._12_4_;
      auVar55._16_4_ = auVar43._16_4_ * auVar29._16_4_ * 0.0;
      auVar55._20_4_ = auVar43._20_4_ * auVar29._20_4_ * 0.0;
      auVar55._24_4_ = auVar43._24_4_ * auVar29._24_4_ * 0.0;
      auVar55._28_4_ = 0;
      auVar16 = vcvtdq2ps_avx(auVar34);
      auVar35 = vfmadd231ps_fma(auVar55,auVar16,auVar82);
      auVar35 = vfmsub231ps_fma(ZEXT1632(auVar35),auVar78,auVar43);
      auVar4 = vsubps_avx(ZEXT1632(auVar35),auVar29);
      auVar35 = vfnmadd231ps_fma(auVar4,auVar80,auVar16);
      auVar16 = vcmpps_avx(ZEXT1632(auVar19),ZEXT832(0) << 0x20,2);
      auVar44._8_4_ = 0x7fffffff;
      auVar44._0_8_ = 0x7fffffff7fffffff;
      auVar44._12_4_ = 0x7fffffff;
      auVar44._16_4_ = 0x7fffffff;
      auVar44._20_4_ = 0x7fffffff;
      auVar44._24_4_ = 0x7fffffff;
      auVar44._28_4_ = 0x7fffffff;
      auVar16 = vblendvps_avx(ZEXT1632(auVar35),auVar44,auVar16);
      auVar4 = vmaxps_avx(*pauVar6,ZEXT832(0) << 0x20);
      auVar16 = vsubps_avx(auVar4,auVar16);
      *pauVar6 = auVar16;
      pauVar6 = pauVar6 + 1;
      lVar9 = lVar9 + 8;
    }
    for (; iVar8 + 3 < iVar7; iVar8 = iVar8 + 4) {
      auVar19._8_4_ = 0x80000000;
      auVar19._0_8_ = 0x8000000080000000;
      auVar19._12_4_ = 0x80000000;
      auVar14 = vorps_avx(*(undefined1 (*) [16])*pauVar6,auVar19);
      auVar20._8_4_ = 0x42b0c0a5;
      auVar20._0_8_ = 0x42b0c0a542b0c0a5;
      auVar20._12_4_ = 0x42b0c0a5;
      auVar14 = vminps_avx(auVar14,auVar20);
      auVar21._8_4_ = 0xc2b0c0a5;
      auVar21._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar21._12_4_ = 0xc2b0c0a5;
      auVar56 = vmaxps_avx(auVar14,auVar21);
      auVar22._8_4_ = 0x3fb8aa3b;
      auVar22._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar22._12_4_ = 0x3fb8aa3b;
      auVar77._8_4_ = 0x3f000000;
      auVar77._0_8_ = 0x3f0000003f000000;
      auVar77._12_4_ = 0x3f000000;
      auVar14 = vfmadd213ps_fma(auVar22,auVar56,auVar77);
      auVar30._0_4_ = (int)auVar14._0_4_;
      auVar30._4_4_ = (int)auVar14._4_4_;
      auVar30._8_4_ = (int)auVar14._8_4_;
      auVar30._12_4_ = (int)auVar14._12_4_;
      auVar19 = vcvtdq2ps_avx(auVar30);
      auVar14 = vcmpps_avx(auVar14,auVar19,1);
      auVar14 = vandps_avx(auVar35,auVar14);
      auVar14 = vsubps_avx(auVar19,auVar14);
      auVar79._8_4_ = 0x3f318000;
      auVar79._0_8_ = 0x3f3180003f318000;
      auVar79._12_4_ = 0x3f318000;
      auVar19 = vfmsub231ps_fma(auVar56,auVar14,auVar79);
      auVar81._8_4_ = 0xb95e8083;
      auVar81._0_8_ = 0xb95e8083b95e8083;
      auVar81._12_4_ = 0xb95e8083;
      auVar56 = vfnmsub231ps_fma(auVar19,auVar14,auVar81);
      auVar31._0_4_ = auVar56._0_4_ * auVar56._0_4_;
      auVar31._4_4_ = auVar56._4_4_ * auVar56._4_4_;
      auVar31._8_4_ = auVar56._8_4_ * auVar56._8_4_;
      auVar31._12_4_ = auVar56._12_4_ * auVar56._12_4_;
      auVar36._8_4_ = 0x39506967;
      auVar36._0_8_ = 0x3950696739506967;
      auVar36._12_4_ = 0x39506967;
      auVar45._8_4_ = 0x3ab743ce;
      auVar45._0_8_ = 0x3ab743ce3ab743ce;
      auVar45._12_4_ = 0x3ab743ce;
      auVar19 = vfmadd213ps_fma(auVar36,auVar56,auVar45);
      auVar46._8_4_ = 0x3c088908;
      auVar46._0_8_ = 0x3c0889083c088908;
      auVar46._12_4_ = 0x3c088908;
      auVar19 = vfmadd213ps_fma(auVar19,auVar56,auVar46);
      auVar47._8_4_ = 0x3d2aa9c1;
      auVar47._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar47._12_4_ = 0x3d2aa9c1;
      auVar19 = vfmadd213ps_fma(auVar19,auVar56,auVar47);
      auVar48._8_4_ = 0x3e2aaaaa;
      auVar48._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar48._12_4_ = 0x3e2aaaaa;
      auVar19 = vfmadd213ps_fma(auVar19,auVar56,auVar48);
      auVar19 = vfmadd213ps_fma(auVar19,auVar56,auVar77);
      auVar19 = vfmadd213ps_fma(auVar19,auVar31,auVar56);
      auVar32._0_4_ = auVar83._0_4_ + auVar19._0_4_;
      auVar32._4_4_ = auVar83._4_4_ + auVar19._4_4_;
      auVar32._8_4_ = auVar83._8_4_ + auVar19._8_4_;
      auVar32._12_4_ = auVar83._12_4_ + auVar19._12_4_;
      auVar15._0_4_ = (int)auVar14._0_4_;
      auVar15._4_4_ = (int)auVar14._4_4_;
      auVar15._8_4_ = (int)auVar14._8_4_;
      auVar15._12_4_ = (int)auVar14._12_4_;
      auVar14 = vpslld_avx(auVar15,0x17);
      auVar14 = vpaddd_avx(auVar35,auVar14);
      auVar20 = vfmadd213ps_fma(auVar14,auVar32,auVar35);
      auVar23._8_4_ = 0x800000;
      auVar23._0_8_ = 0x80000000800000;
      auVar23._12_4_ = 0x800000;
      auVar14 = vmaxps_avx(auVar20,auVar23);
      auVar19 = vpsrld_avx(auVar14,0x17);
      auVar37._8_4_ = 0xffffff82;
      auVar37._0_8_ = 0xffffff82ffffff82;
      auVar37._12_4_ = 0xffffff82;
      auVar19 = vpaddd_avx(auVar19,auVar37);
      auVar38._8_4_ = 0x807fffff;
      auVar38._0_8_ = 0x807fffff807fffff;
      auVar38._12_4_ = 0x807fffff;
      auVar14 = vandps_avx(auVar14,auVar38);
      auVar15 = vorps_avx(auVar14,auVar77);
      auVar56 = vcvtdq2ps_avx(auVar19);
      auVar39._8_4_ = 0x3f3504f3;
      auVar39._0_8_ = 0x3f3504f33f3504f3;
      auVar39._12_4_ = 0x3f3504f3;
      auVar19 = vcmpps_avx(auVar15,auVar39,1);
      auVar14 = vandps_avx(auVar19,auVar15);
      auVar24._0_4_ = auVar15._0_4_ + -1.0 + auVar14._0_4_;
      auVar24._4_4_ = auVar15._4_4_ + -1.0 + auVar14._4_4_;
      auVar24._8_4_ = auVar15._8_4_ + -1.0 + auVar14._8_4_;
      auVar24._12_4_ = auVar15._12_4_ + -1.0 + auVar14._12_4_;
      auVar14 = vandps_avx(auVar35,auVar19);
      auVar14 = vsubps_avx(auVar56,auVar14);
      auVar40._0_4_ = auVar24._0_4_ * auVar24._0_4_;
      auVar40._4_4_ = auVar24._4_4_ * auVar24._4_4_;
      auVar40._8_4_ = auVar24._8_4_ * auVar24._8_4_;
      auVar40._12_4_ = auVar24._12_4_ * auVar24._12_4_;
      auVar49._8_4_ = 0x3d9021bb;
      auVar49._0_8_ = 0x3d9021bb3d9021bb;
      auVar49._12_4_ = 0x3d9021bb;
      auVar57._8_4_ = 0xbdebd1b8;
      auVar57._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar57._12_4_ = 0xbdebd1b8;
      auVar19 = vfmadd213ps_fma(auVar49,auVar24,auVar57);
      auVar58._8_4_ = 0x3def251a;
      auVar58._0_8_ = 0x3def251a3def251a;
      auVar58._12_4_ = 0x3def251a;
      auVar19 = vfmadd213ps_fma(auVar19,auVar24,auVar58);
      auVar59._8_4_ = 0xbdfe5d4f;
      auVar59._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar59._12_4_ = 0xbdfe5d4f;
      auVar19 = vfmadd213ps_fma(auVar19,auVar24,auVar59);
      auVar60._8_4_ = 0x3e11e9bf;
      auVar60._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar60._12_4_ = 0x3e11e9bf;
      auVar19 = vfmadd213ps_fma(auVar19,auVar24,auVar60);
      auVar61._8_4_ = 0xbe2aae50;
      auVar61._0_8_ = 0xbe2aae50be2aae50;
      auVar61._12_4_ = 0xbe2aae50;
      auVar19 = vfmadd213ps_fma(auVar19,auVar24,auVar61);
      auVar62._8_4_ = 0x3e4cceac;
      auVar62._0_8_ = 0x3e4cceac3e4cceac;
      auVar62._12_4_ = 0x3e4cceac;
      auVar19 = vfmadd213ps_fma(auVar19,auVar24,auVar62);
      auVar63._8_4_ = 0xbe7ffffc;
      auVar63._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar63._12_4_ = 0xbe7ffffc;
      auVar19 = vfmadd213ps_fma(auVar19,auVar24,auVar63);
      auVar64._8_4_ = 0x3eaaaaaa;
      auVar64._0_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar64._12_4_ = 0x3eaaaaaa;
      auVar19 = vfmadd213ps_fma(auVar19,auVar24,auVar64);
      auVar50._0_4_ = auVar40._0_4_ * auVar24._0_4_ * auVar19._0_4_;
      auVar50._4_4_ = auVar40._4_4_ * auVar24._4_4_ * auVar19._4_4_;
      auVar50._8_4_ = auVar40._8_4_ * auVar24._8_4_ * auVar19._8_4_;
      auVar50._12_4_ = auVar40._12_4_ * auVar24._12_4_ * auVar19._12_4_;
      auVar19 = vfmadd231ps_fma(auVar50,auVar14,auVar81);
      auVar19 = vfmsub231ps_fma(auVar19,auVar77,auVar40);
      auVar19 = vsubps_avx(auVar19,auVar24);
      auVar19 = vfnmadd231ps_fma(auVar19,auVar79,auVar14);
      auVar14 = vcmpps_avx(auVar20,ZEXT816(0) << 0x20,2);
      auVar41._8_4_ = 0x7fffffff;
      auVar41._0_8_ = 0x7fffffff7fffffff;
      auVar41._12_4_ = 0x7fffffff;
      auVar14 = vblendvps_avx(auVar19,auVar41,auVar14);
      auVar19 = vmaxps_avx(*(undefined1 (*) [16])*pauVar6,ZEXT816(0) << 0x20);
      auVar14 = vsubps_avx(auVar19,auVar14);
      *(undefined1 (*) [16])*pauVar6 = auVar14;
      pauVar6 = (undefined1 (*) [32])(*pauVar6 + 0x10);
      lVar9 = lVar9 + 4;
    }
    lVar5 = sVar3 * sVar2 * uVar11;
    for (; (int)lVar9 < iVar7; lVar9 = lVar9 + 1) {
      fVar13 = *(float *)((long)pvVar1 + lVar9 * 4 + lVar5);
      if (fVar13 <= 0.0) {
        fVar13 = expf(fVar13);
        fVar12 = logf(fVar13 + 1.0);
      }
      else {
        fVar12 = expf(-fVar13);
        fVar12 = logf(fVar12 + 1.0);
        fVar12 = fVar12 + fVar13;
      }
      *(float *)((long)pvVar1 + lVar9 * 4 + lVar5) = fVar12;
      auVar83 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
    }
  }
  return 0;
}

Assistant:

int BNLL_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __mmask16 mask = _mm512_cmp_ps_mask(_p, _zero_avx512, _CMP_GT_OQ);
            __m512 _abs_p = _mm512_castsi512_ps(_mm512_and_epi32(_mm512_castps_si512(_p), _mm512_set1_epi32(0x7fffffff)));
            __m512 _tmp = log512_ps(_mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _abs_p))));
            _p = _mm512_mask_add_ps(_tmp, mask, _tmp, _p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 mask = _mm256_cmp_ps(_p, _mm256_setzero_ps(), _CMP_GT_OQ);
            __m256 _abs_p = _mm256_and_ps(_p, *(__m256*)_ps256_inv_sign_mask);
            __m256 _tmp = log256_ps(_mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _abs_p))));
            __m256 _x = _mm256_and_ps(_p, mask);
            _p = _mm256_add_ps(_x, _tmp);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 mask = _mm_cmpgt_ps(_p, _zero);
            __m128 _abs_p = _mm_and_ps(_p, *(__m128*)_ps_inv_sign_mask);
            __m128 _tmp = log_ps(_mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _abs_p))));
            __m128 _x = _mm_and_ps(_p, mask);
            _p = _mm_add_ps(_x, _tmp);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr > 0)
                *ptr = static_cast<float>(*ptr + log(1.f + exp(-(*ptr))));
            else
                *ptr = static_cast<float>(log(1.f + exp(*ptr)));
            ptr++;
        }
    }
    return 0;
}